

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O2

void __thiscall EDCircles::JoinArcs2(EDCircles *this)

{
  MyArc *__src;
  uint uVar1;
  int sy;
  int ey;
  int iVar2;
  MyArc *pMVar3;
  BufferManager *pBVar4;
  EDArcs *pEVar5;
  int iVar6;
  void *pvVar7;
  undefined8 *puVar8;
  double *pdVar9;
  bool bVar10;
  ulong uVar11;
  undefined8 *puVar12;
  int iVar13;
  uint uVar14;
  uint *puVar15;
  EDCircles *this_00;
  double *in_R9;
  ulong uVar16;
  long lVar17;
  int *piVar18;
  uint uVar19;
  double *x;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  bool bVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  double dVar30;
  double dVar31;
  double dVar32;
  uint local_238c;
  ulong local_2378;
  double *local_2360;
  ulong local_2348;
  undefined8 *local_2330;
  double local_22f0;
  double R;
  double YC;
  double XC;
  undefined8 local_22b8;
  undefined8 uStack_22b0;
  int *local_22a8;
  double local_22a0;
  uint *local_2298;
  int *local_2290;
  ulong local_2288;
  double CircleFitError;
  double eTheta;
  EllipseEquation eq;
  EllipseEquation Eq;
  AngleSet local_2200;
  
  sortArc(this->edarcs2->arcs,this->edarcs2->noArcs);
  uVar1 = this->edarcs2->noArcs;
  uVar21 = (ulong)(int)uVar1;
  pMVar3 = this->edarcs2->arcs;
  uVar11 = uVar21;
  if ((long)uVar21 < 0) {
    uVar11 = 0xffffffffffffffff;
  }
  pvVar7 = operator_new__(uVar11);
  uVar11 = 0;
  uVar16 = 0;
  if (0 < (int)uVar1) {
    uVar16 = (ulong)uVar1;
  }
  for (; uVar16 != uVar11; uVar11 = uVar11 + 1) {
    *(undefined1 *)((long)pvVar7 + uVar11) = 0;
  }
  uVar11 = uVar21 << 4;
  if ((int)uVar1 < 0) {
    uVar11 = 0xffffffffffffffff;
  }
  puVar8 = (undefined8 *)operator_new__(uVar11);
  local_22a8 = &this->noCircles1;
  local_2290 = &pMVar3[1].ey;
  local_2298 = (uint *)((long)puVar8 + 4);
  uVar11 = 0;
LAB_0010b65d:
  if (uVar11 == uVar16) {
    operator_delete__(pvVar7);
    operator_delete__(puVar8);
    return;
  }
  if (*(char *)((long)pvVar7 + uVar11) == '\0') {
    EllipseEquation::EllipseEquation(&Eq);
    __src = pMVar3 + uVar11;
    local_22f0 = pMVar3[uVar11].r;
    iVar13 = pMVar3[uVar11].turn;
    local_2378 = (ulong)pMVar3[uVar11].noPixels;
    local_238c = pMVar3[uVar11].sx;
    sy = pMVar3[uVar11].sy;
    local_2360 = (double *)(ulong)(uint)pMVar3[uVar11].ex;
    pBVar4 = this->bm;
    this_00 = (EDCircles *)(pBVar4->x + pBVar4->index);
    x = pBVar4->y + pBVar4->index;
    ey = pMVar3[uVar11].ey;
    memcpy(this_00,pMVar3[uVar11].x,local_2378 << 3);
    memcpy(x,pMVar3[uVar11].y,local_2378 << 3);
    local_2200.head = -1;
    local_2200.next = 0;
    local_2200.overlapAmount = 0.0;
    AngleSet::set(&local_2200,pMVar3[uVar11].sTheta,pMVar3[uVar11].eTheta);
    bVar10 = false;
    local_2348 = local_2378;
LAB_0010b77b:
    local_22b8 = (int *)CONCAT44(sy,sy);
    uStack_22b0 = 0;
    lVar22 = 0;
    uVar14 = 0;
    uVar21 = uVar11;
    local_2330 = puVar8;
LAB_0010b7b5:
    piVar18 = local_2290 + uVar21 * 0x2a;
    do {
      uVar21 = uVar21 + 1;
      uVar20 = (ulong)uVar14;
      if ((int)uVar1 <= (int)uVar21) {
        if (uVar14 == 0) goto LAB_0010bc8a;
        local_22b8 = &(this_00->super_EDPF).super_ED.width + (long)(int)local_2378 * 2;
        uVar21 = 0;
        puVar15 = local_2298;
        goto LAB_0010ba08;
      }
      if (((*(char *)((long)pvVar7 + uVar21) == '\0') && (piVar18[-4] == __src->segmentNo)) &&
         (piVar18[-5] == iVar13)) {
        dVar24 = *(double *)(piVar18 + -0xf);
        dVar27 = dVar24;
        if (local_22f0 <= dVar24) {
          dVar27 = local_22f0;
        }
        if ((ABS(local_22f0 - dVar24) <= dVar27 * 2.5) &&
           (dVar24 = AngleSet::overlap(&local_2200,*(double *)(piVar18 + -0xb),
                                       *(double *)(piVar18 + -9)), dVar24 < 0.75)) {
          iVar6 = piVar18[-2];
          iVar2 = *piVar18;
          dVar24 = (double)(int)(local_238c - piVar18[-1]);
          dVar27 = (double)(int)(local_238c - piVar18[-3]);
          auVar28._4_4_ = iVar6;
          auVar28._0_4_ = iVar2;
          auVar28._8_8_ = 0;
          auVar29._0_8_ =
               dVar24 * dVar24 +
               (double)((int)local_22b8 - iVar2) * (double)((int)local_22b8 - iVar2);
          auVar29._8_8_ =
               dVar27 * dVar27 +
               (double)(local_22b8._4_4_ - iVar6) * (double)(local_22b8._4_4_ - iVar6);
          auVar29 = sqrtpd(auVar28,auVar29);
          dVar30 = auVar29._8_8_;
          dVar27 = auVar29._0_8_;
          dVar24 = dVar27;
          if (dVar30 <= dVar27) {
            dVar24 = dVar30;
          }
          dVar25 = (double)(int)((uint)local_2360 - piVar18[-3]);
          dVar31 = SQRT(dVar25 * dVar25 + (double)(ey - iVar6) * (double)(ey - iVar6));
          dVar25 = dVar31;
          if (dVar24 <= dVar31) {
            dVar25 = dVar24;
          }
          dVar26 = (double)(int)((uint)local_2360 - piVar18[-1]);
          dVar32 = SQRT(dVar26 * dVar26 + (double)(ey - iVar2) * (double)(ey - iVar2));
          dVar26 = dVar32;
          if (dVar25 <= dVar32) {
            dVar26 = dVar25;
          }
          in_R9 = local_2360;
          if (dVar26 <= 5.0) goto LAB_0010b941;
        }
      }
      piVar18 = piVar18 + 0x2a;
    } while( true );
  }
  goto LAB_0010be85;
LAB_0010ba08:
  bVar23 = lVar22 != 0;
  lVar22 = lVar22 + -1;
  if (bVar23) {
    lVar17 = (long)(int)puVar15[-1];
    local_2288 = (ulong)*puVar15;
    memcpy(local_22b8,pMVar3[lVar17].x,(long)pMVar3[lVar17].noPixels << 3);
    memcpy(x + (int)local_2378,pMVar3[lVar17].y,(long)pMVar3[lVar17].noPixels << 3);
    uVar14 = pMVar3[lVar17].noPixels + (int)local_2378;
    EllipseEquation::EllipseEquation(&eq);
    bVar23 = EllipseFit(this_00,x,(double *)(ulong)uVar14,(int)&eq,(EllipseEquation *)0x1,(int)in_R9
                       );
    if ((!bVar23) || (dVar24 = ComputeEllipseError(&eq,(double *)this_00,x,uVar14), 1.5 < dVar24))
    goto LAB_0010bac0;
    Eq.coeff[6] = eq.coeff[6];
    Eq.coeff[4] = eq.coeff[4];
    Eq.coeff[5] = eq.coeff[5];
    Eq.coeff[2] = eq.coeff[2];
    Eq.coeff[3] = eq.coeff[3];
    Eq.coeff[0] = eq.coeff[0];
    Eq.coeff[1] = eq.coeff[1];
    *(undefined1 *)((long)pvVar7 + lVar17) = 1;
    *(undefined1 *)((long)pvVar7 + uVar11) = 1;
    local_22f0 = (local_22f0 + pMVar3[lVar17].r) * 0.5;
    AngleSet::set(&local_2200,pMVar3[lVar17].sTheta,pMVar3[lVar17].eTheta);
    pdVar9 = local_2360;
    switch((int)local_2288) {
    case 1:
      uVar19 = pMVar3[lVar17].ex;
      iVar6 = pMVar3[lVar17].ey;
      break;
    case 2:
      uVar19 = pMVar3[lVar17].sx;
      iVar6 = pMVar3[lVar17].sy;
      break;
    case 3:
      uVar19 = pMVar3[lVar17].ex;
      ey = pMVar3[lVar17].ey;
      goto LAB_0010bbe5;
    case 4:
      uVar19 = pMVar3[lVar17].sx;
      ey = pMVar3[lVar17].sy;
LAB_0010bbe5:
      pdVar9 = (double *)(ulong)uVar19;
    default:
      goto switchD_0010bbbd_default;
    }
    iVar13 = (uint)(iVar13 != 1) * 2 + -1;
    pdVar9 = (double *)(ulong)uVar19;
    sy = ey;
    ey = iVar6;
    local_238c = (uint)local_2360;
switchD_0010bbbd_default:
    bVar10 = true;
    local_2378 = (ulong)uVar14;
    local_2360 = pdVar9;
    local_2348 = local_2378;
    local_22a0 = dVar24;
  }
  goto LAB_0010bc77;
LAB_0010bac0:
  uVar21 = uVar21 + 1;
  puVar15 = puVar15 + 4;
  goto LAB_0010ba08;
LAB_0010bc77:
  if (uVar20 <= uVar21) goto LAB_0010bc8a;
  goto LAB_0010b77b;
LAB_0010bc8a:
  if (bVar10) {
    AngleSet::computeStartEndTheta(&local_2200,eq.coeff,&eTheta);
    in_R9 = &R;
    CircleFit((double *)this_00,x,(int)local_2348,&XC,&YC,in_R9,&CircleFitError);
    if ((((double)(-(ulong)(eq.coeff[0] < eTheta) & (ulong)-eq.coeff[0] |
                  ~-(ulong)(eq.coeff[0] < eTheta) & (ulong)(6.283185307179586 - eq.coeff[0])) +
         eTheta) / 6.283185307179586 < 0.67) || (1.5 < CircleFitError)) {
      in_R9 = (double *)(ulong)local_238c;
      addArc(this->edarcs3->arcs,&this->edarcs3->noArcs,XC,YC,R,CircleFitError,eq.coeff[0],eTheta,
             iVar13,__src->segmentNo,&Eq,local_22a0,local_238c,sy,(uint)local_2360,ey,
             (double *)this_00,x,(int)local_2348,local_2200.overlapAmount / 6.283185307179586);
    }
    else {
      addCircle(this->circles1,local_22a8,XC,YC,R,CircleFitError,(double *)this_00,x,(int)local_2348
               );
    }
    piVar18 = &this->bm->index;
    *piVar18 = *piVar18 + (int)local_2348;
  }
  else {
    pEVar5 = this->edarcs3;
    iVar13 = pEVar5->noArcs;
    pEVar5->noArcs = iVar13 + 1;
    memcpy(pEVar5->arcs + iVar13,__src,0xa8);
  }
LAB_0010be85:
  uVar11 = uVar11 + 1;
  goto LAB_0010b65d;
LAB_0010b941:
  iVar6 = (dVar27 < dVar30) + 1;
  if (dVar31 < dVar24) {
    iVar6 = 3;
  }
  puVar12 = local_2330;
  if (dVar32 < dVar25) {
    iVar6 = 4;
  }
  for (; uVar19 = (uint)uVar20, 0 < (int)uVar19; uVar20 = uVar20 - 1) {
    if ((double)puVar12[-1] <= dVar26 && dVar26 != (double)puVar12[-1]) goto LAB_0010b98b;
    *puVar12 = puVar12[-2];
    puVar12[1] = puVar12[-1];
    puVar12 = puVar12 + -2;
  }
  uVar19 = 0;
LAB_0010b98b:
  uVar20 = (ulong)(uVar19 & 0x7fffffff);
  *(int *)(puVar8 + uVar20 * 2) = (int)uVar21;
  *(int *)((long)puVar8 + uVar20 * 0x10 + 4) = iVar6;
  puVar8[uVar20 * 2 + 1] = dVar26;
  uVar14 = uVar14 + 1;
  local_2330 = local_2330 + 2;
  lVar22 = lVar22 + 1;
  goto LAB_0010b7b5;
}

Assistant:

void EDCircles::JoinArcs2()
{
	AngleSet angles;

	// Sort the arcs with respect to their length so that longer arcs are at the beginning
	sortArc(edarcs2->arcs, edarcs2->noArcs);

	int noArcs = edarcs2->noArcs;
	MyArc *arcs = edarcs2->arcs;

	bool *taken = new bool[noArcs];
	for (int i = 0; i<noArcs; i++) taken[i] = false;

	struct CandidateArc {
		int arcNo;
		int which;    // 1: (SX, SY)-(sx, sy), 2: (SX, SY)-(ex, ey), 3: (EX, EY)-(sx, sy), 4: (EX, EY)-(ex, ey)
		double dist;  // min distance between the end points
	};

	CandidateArc *candidateArcs = new CandidateArc[noArcs];
	int noCandidateArcs;

	for (int i = 0; i<noArcs; i++) {
		if (taken[i]) continue;

		// Current arc
		bool EllipseEqValid = false;
		EllipseEquation Eq;
		double EllipseFitError;

		double R = arcs[i].r;
		int Turn = arcs[i].turn;
		int NoPixels = arcs[i].noPixels;

		int SX = arcs[i].sx;
		int SY = arcs[i].sy;
		int EX = arcs[i].ex;
		int EY = arcs[i].ey;

		// Take the pixels making up this arc
		int noPixels = arcs[i].noPixels;

		double *x = bm->getX();
		double *y = bm->getY();
		memcpy(x, arcs[i].x, noPixels * sizeof(double));
		memcpy(y, arcs[i].y, noPixels * sizeof(double));

		angles.clear();
		angles.set(arcs[i].sTheta, arcs[i].eTheta);

		while (1) {
			bool extendedArc = false;

			// Find other arcs to join with
			noCandidateArcs = 0;

			for (int j = i + 1; j<noArcs; j++) {
				if (taken[j]) continue;
				if (arcs[j].segmentNo != arcs[i].segmentNo) continue;
				if (arcs[j].turn != Turn) continue;

				double minR = MIN(R, arcs[j].r);
				double radiusDiffThreshold = minR*2.5;

				double diff = fabs(R - arcs[j].r);
				if (diff > radiusDiffThreshold) continue;

				// If 75% of the current arc overlaps with the existing arc, then ignore this arc
				if (angles.overlap(arcs[j].sTheta, arcs[j].eTheta) >= 0.75) continue;

				// Compute the distances
				// 1: (SX, SY)-(sx, sy)
				double dx = SX - arcs[j].sx;
				double dy = SY - arcs[j].sy;
				double d = sqrt(dx*dx + dy*dy);
				int which = 1;

				// 2: (SX, SY)-(ex, ey)
				dx = SX - arcs[j].ex;
				dy = SY - arcs[j].ey;
				double d2 = sqrt(dx*dx + dy*dy);
				if (d2 < d) { d = d2; which = 2; }

				// 3: (EX, EY)-(sx, sy)
				dx = EX - arcs[j].sx;
				dy = EY - arcs[j].sy;
				d2 = sqrt(dx*dx + dy*dy);
				if (d2 < d) { d = d2; which = 3; }

				// 4: (EX, EY)-(ex, ey)
				dx = EX - arcs[j].ex;
				dy = EY - arcs[j].ey;
				d2 = sqrt(dx*dx + dy*dy);
				if (d2 < d) { d = d2; which = 4; }

				// Endpoints must be very close
				double maxDistanceBetweenEndpoints = 5; //10; 
				if (d > maxDistanceBetweenEndpoints) continue;

				// Add to candidate arcs in sorted order. User insertion sort
				int index = noCandidateArcs - 1;
				while (index >= 0) {
					if (candidateArcs[index].dist < d) break;

					candidateArcs[index + 1] = candidateArcs[index];
					index--;
				} //end-while

				  // Add the new candidate arc to the candidate list
				index++;
				candidateArcs[index].arcNo = j;
				candidateArcs[index].which = which;
				candidateArcs[index].dist = d;
				noCandidateArcs++;
			} //end-for

			  // Try to join the current arc with the candidate arc (if there is one)
			if (noCandidateArcs > 0) {
				for (int j = 0; j<noCandidateArcs; j++) {
					int CandidateArcNo = candidateArcs[j].arcNo;
					int Which = candidateArcs[j].which;

					int noPixelsSave = noPixels;
					memcpy(x + noPixels, arcs[CandidateArcNo].x, arcs[CandidateArcNo].noPixels * sizeof(double));
					memcpy(y + noPixels, arcs[CandidateArcNo].y, arcs[CandidateArcNo].noPixels * sizeof(double));
					noPixels += arcs[CandidateArcNo].noPixels;

					// Directly fit an ellipse
					EllipseEquation eq;
					double ellipseFitError = 1e10;
					if (EllipseFit(x, y, noPixels, &eq)) ellipseFitError = ComputeEllipseError(&eq, x, y, noPixels);

					if (ellipseFitError > ELLIPSE_ERROR) {
						// No match. Continue with the next candidate
						noPixels = noPixelsSave;

					}
					else {
						// Match. Take it
						extendedArc = true;
						EllipseEqValid = true;
						Eq = eq;
						EllipseFitError = ellipseFitError;
						NoPixels = noPixels;

						taken[CandidateArcNo] = true;
						taken[i] = true;

						R = (R + arcs[CandidateArcNo].r) / 2.0;

						angles.set(arcs[CandidateArcNo].sTheta, arcs[CandidateArcNo].eTheta);

						// Update the end points of the new arc
						switch (Which) {
							// (SX, SY)-(sy, sy)
						case 1: SX = EX, SY = EY; EX = arcs[CandidateArcNo].ex; EY = arcs[CandidateArcNo].ey;
							if (Turn == 1) Turn = -1; else Turn = 1; // reverse the turn direction
							break;

							// (SX, SY)-(ex, ey)
						case 2: SX = EX, SY = EY; EX = arcs[CandidateArcNo].sx; EY = arcs[CandidateArcNo].sy;
							if (Turn == 1) Turn = -1; else Turn = 1; // reverse the turn direction
							break;

							// (EX, EY)-(sx, sy)
						case 3: EX = arcs[CandidateArcNo].ex; EY = arcs[CandidateArcNo].ey; break;

							// (EX, EY)-(ex, ey)
						case 4: EX = arcs[CandidateArcNo].sx; EY = arcs[CandidateArcNo].sy; break;
						} //end-switch

						break; // Do not look at the other candidates
					} //end-if
				} //end-for
			} //end-if

			if (extendedArc == false) break;
		} //end-while

		if (EllipseEqValid == false) {
			// Add to arcs
			edarcs3->arcs[edarcs3->noArcs++] = arcs[i];

		}
		else {
			// Add the current OR the extended arc to the new arcs
			double sTheta, eTheta;
			angles.computeStartEndTheta(sTheta, eTheta);

			double XC, YC, R, CircleFitError;
			CircleFit(x, y, NoPixels, &XC, &YC, &R, &CircleFitError);

			double coverage = ArcLength(sTheta, eTheta) / TWOPI;
			if ((coverage >= FULL_CIRCLE_RATIO && CircleFitError <= LONG_ARC_ERROR))
				addCircle(circles1, noCircles1, XC, YC, R, CircleFitError, x, y, NoPixels);
			else
				addArc(edarcs3->arcs, edarcs3->noArcs, XC, YC, R, CircleFitError, sTheta, eTheta, Turn, arcs[i].segmentNo, &Eq, EllipseFitError, SX, SY, EX, EY, x, y, NoPixels, angles.overlapRatio());

			// Move buffer pointers
			bm->move(NoPixels);
		} //end-if
	} //end-for

	delete[] taken;
	delete[] candidateArcs;
}